

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

Stats * __thiscall LockedPool::stats(LockedPool *this)

{
  long lVar1;
  bool bVar2;
  _Self *in_RSI;
  Stats *in_RDI;
  long in_FS_OFFSET;
  LockedPageArena *arena;
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *__range1;
  Stats i;
  const_iterator __end1;
  const_iterator __begin1;
  lock_guard<std::mutex> lock;
  Stats *this_00;
  Arena *in_stack_ffffffffffffffb8;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RDI,(mutex_type *)0xffffec);
  memset(this_00,0,0x30);
  this_00->locked = (size_t)in_RSI[5]._M_node;
  std::__cxx11::list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>::
  begin((list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *)this_00);
  std::__cxx11::list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>::end
            ((list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *)
             this_00);
  while( true ) {
    bVar2 = std::operator==(in_RSI,(_Self *)this_00);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_List_const_iterator<LockedPool::LockedPageArena>::operator*
              ((_List_const_iterator<LockedPool::LockedPageArena> *)in_RDI);
    Arena::stats(in_stack_ffffffffffffffb8);
    this_00->used = (long)&in_stack_ffffffffffffffb8->_vptr_Arena + this_00->used;
    this_00->free = local_40 + this_00->free;
    this_00->total = local_38 + this_00->total;
    this_00->chunks_used = local_30 + this_00->chunks_used;
    this_00->chunks_free = local_28 + this_00->chunks_free;
    std::_List_const_iterator<LockedPool::LockedPageArena>::operator++
              ((_List_const_iterator<LockedPool::LockedPageArena> *)in_RDI);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

LockedPool::Stats LockedPool::stats() const
{
    std::lock_guard<std::mutex> lock(mutex);
    LockedPool::Stats r{0, 0, 0, cumulative_bytes_locked, 0, 0};
    for (const auto &arena: arenas) {
        Arena::Stats i = arena.stats();
        r.used += i.used;
        r.free += i.free;
        r.total += i.total;
        r.chunks_used += i.chunks_used;
        r.chunks_free += i.chunks_free;
    }
    return r;
}